

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example-quadratic.cpp
# Opt level: O2

double foo(VectorXd *x,VectorXd *grad)

{
  int i;
  long lVar1;
  RealScalar RVar2;
  VectorXd d;
  int n;
  Matrix<double,__1,_1,_0,__1,_1> local_80;
  int local_6c;
  VectorXd *local_68;
  VectorXd *local_60;
  Matrix<double,__1,_1,_0,__1,_1> *local_58;
  undefined8 local_48;
  VectorXd *local_40;
  Matrix<double,__1,_1,_0,__1,_1> *local_38;
  
  local_6c = (int)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_80,&local_6c);
  for (lVar1 = 0; lVar1 < local_6c; lVar1 = lVar1 + 1) {
    local_80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar1]
         = (double)(int)lVar1;
  }
  local_60 = x;
  local_58 = &local_80;
  RVar2 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)&local_60);
  local_58 = (Matrix<double,__1,_1,_0,__1,_1> *)
             local_80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
  local_48 = 0x4000000000000000;
  local_68 = grad;
  local_40 = x;
  local_38 = &local_80;
  Eigen::NoAlias<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::MatrixBase> *)&local_68,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_60);
  free(local_80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return RVar2;
}

Assistant:

double foo(const VectorXd& x, VectorXd& grad)
{
    const int n = x.size();
    VectorXd d(n);
    for(int i = 0; i < n; i++)
        d[i] = i;

    double f = (x - d).squaredNorm();
    grad.noalias() = 2.0 * (x - d);
    return f;
}